

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowStorageDeviceType::~IfcFlowStorageDeviceType
          (IfcFlowStorageDeviceType *this,void **vtt)

{
  void **vtt_local;
  IfcFlowStorageDeviceType *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFlowStorageDeviceType,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcFlowStorageDeviceType,_0UL> *)
             &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
              field_0x1a0,vtt + 0x32);
  IfcDistributionFlowElementType::~IfcDistributionFlowElementType
            (&this->super_IfcDistributionFlowElementType,vtt + 1);
  return;
}

Assistant:

IfcFlowStorageDeviceType() : Object("IfcFlowStorageDeviceType") {}